

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O0

void __thiscall
kj::TlsConnection::TlsConnection(TlsConnection *this,AsyncIoStream *stream,SSL_CTX *ctx)

{
  SSL *pSVar1;
  BIO_METHOD *type;
  BIO *rbio;
  BIO *bio;
  SSL_CTX *ctx_local;
  AsyncIoStream *stream_local;
  TlsConnection *this_local;
  
  AsyncIoStream::AsyncIoStream(&this->super_AsyncIoStream);
  (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
       (_func_int **)&PTR_read_00c16210;
  (this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream =
       (_func_int **)&PTR_write_00c162a8;
  this->inner = stream;
  Own<kj::AsyncIoStream,_std::nullptr_t>::Own(&this->ownInner);
  Maybe<kj::Promise<void>_>::Maybe(&this->shutdownTask);
  ReadyInputStreamWrapper::ReadyInputStreamWrapper
            (&this->readBuffer,&stream->super_AsyncInputStream);
  ReadyOutputStreamWrapper::ReadyOutputStreamWrapper
            (&this->writeBuffer,&stream->super_AsyncOutputStream);
  pSVar1 = SSL_new((SSL_CTX *)ctx);
  this->ssl = (SSL *)pSVar1;
  if (this->ssl == (SSL *)0x0) {
    anon_unknown_307::throwOpensslError();
  }
  type = (BIO_METHOD *)getBioVtable();
  rbio = BIO_new(type);
  if (rbio == (BIO *)0x0) {
    SSL_free((SSL *)this->ssl);
    anon_unknown_307::throwOpensslError();
  }
  BIO_set_data(rbio,this);
  BIO_set_init(rbio,1);
  SSL_set_bio((SSL *)this->ssl,rbio,rbio);
  return;
}

Assistant:

TlsConnection(kj::AsyncIoStream& stream, SSL_CTX* ctx)
      : inner(stream), readBuffer(stream), writeBuffer(stream) {
    ssl = SSL_new(ctx);
    if (ssl == nullptr) {
      throwOpensslError();
    }

    BIO* bio = BIO_new(const_cast<BIO_METHOD*>(getBioVtable()));
    if (bio == nullptr) {
      SSL_free(ssl);
      throwOpensslError();
    }

    BIO_set_data(bio, this);
    BIO_set_init(bio, 1);
    SSL_set_bio(ssl, bio, bio);
  }